

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

FuncType * __thiscall wabt::Module::GetFuncType(Module *this,Var *var)

{
  Index IVar1;
  size_type sVar2;
  reference ppTVar3;
  Index index;
  Var *var_local;
  Module *this_local;
  
  IVar1 = BindingHash::FindIndex(&this->type_bindings,var);
  sVar2 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::size(&this->types);
  if (IVar1 < sVar2) {
    ppTVar3 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::operator[]
                        (&this->types,(ulong)IVar1);
    this_local = (Module *)cast<wabt::FuncType,wabt::TypeEntry>(*ppTVar3);
  }
  else {
    this_local = (Module *)0x0;
  }
  return (FuncType *)this_local;
}

Assistant:

FuncType* Module::GetFuncType(const Var& var) {
  Index index = type_bindings.FindIndex(var);
  if (index >= types.size()) {
    return nullptr;
  }
  return cast<FuncType>(types[index]);
}